

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_float>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_float>_>
         *this)

{
  Precision PVar1;
  Samplings<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar2;
  pointer pfVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  CommandLine *this_01;
  FloatFormat *fmt_00;
  TestContext *this_02;
  TestLog *this_03;
  MessageBuilder *pMVar7;
  Statement *pSVar8;
  reference ppFVar9;
  ShaderExecutor *pSVar10;
  Variable<float> *pVVar11;
  Variable<vkt::shaderexecutor::Void> *pVVar12;
  reference pvVar13;
  IVal *pIVar14;
  reference pvVar15;
  deUint32 in_stack_ffffffffffffecc8;
  char (*local_11d8) [7];
  pointer local_1108;
  allocator<char> local_10c1;
  string local_10c0;
  undefined4 local_10a0;
  allocator<char> local_1099;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1098;
  string local_1078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  MessageBuilder local_1038;
  MessageBuilder local_eb8;
  int local_d34;
  MessageBuilder local_d30;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  undefined1 local_9f0 [8];
  MessageBuilder builder;
  string local_868;
  Interval local_848;
  allocator<char> local_829;
  string local_828;
  Interval local_808;
  undefined1 local_7f0 [8];
  EvalContext ctx;
  IVal local_7a8;
  IVal local_790;
  IVal local_778;
  IVal local_760;
  undefined1 auStack_748 [8];
  IVal reference1_1;
  undefined1 auStack_728 [8];
  IVal reference0_1;
  pointer pfStack_708;
  bool result;
  size_t valueNdx;
  IVal reference1;
  IVal reference0;
  undefined1 local_6c8 [6];
  IVal in3;
  IVal in2;
  IVal in1;
  IVal in0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  MessageBuilder local_670;
  _Self local_4f0;
  _Self local_4e8;
  const_iterator it;
  FuncSet funcs;
  ostringstream oss;
  MessageBuilder local_338;
  reference local_1b8;
  void *outputArr [2];
  void *inputArr [4];
  TestLog *testLog;
  ResultCollector status;
  Environment env;
  int numErrors;
  int maxMsgs;
  FloatFormat highpFmt;
  undefined1 local_c0 [8];
  Outputs<vkt::shaderexecutor::OutTypes<float,_float>_> outputs;
  size_t numValues;
  int outCount;
  int inCount;
  FloatFormat *fmt;
  Inputs<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_float>_>
  *this_local;
  
  this_00 = this->m_samplings;
  PVar1 = (this->m_caseCtx).precision;
  sVar2 = (this->m_caseCtx).numRandoms;
  inputs.in3.
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  this_01 = tcu::TestContext::getCommandLine((this->m_caseCtx).testContext);
  iVar5 = tcu::CommandLine::getBaseSeed(this_01);
  generateInputs<vkt::shaderexecutor::InTypes<float,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            ((Inputs<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)&fmt,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)&(this->m_caseCtx).floatFormat,(FloatFormat *)(ulong)PVar1,(Precision)sVar2,
             (ulong)(iVar5 + 0xdeadbeef),in_stack_ffffffffffffecc8);
  fmt_00 = &(this->m_caseCtx).floatFormat;
  iVar5 = numInputs<vkt::shaderexecutor::InTypes<float,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                    ();
  iVar6 = numOutputs<vkt::shaderexecutor::OutTypes<float,float>>();
  if (iVar5 < 1) {
    local_1108 = (pointer)0x1;
  }
  else {
    local_1108 = (pointer)std::vector<float,_std::allocator<float>_>::size
                                    ((vector<float,_std::allocator<float>_> *)&fmt);
  }
  outputs.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_1108;
  Outputs<vkt::shaderexecutor::OutTypes<float,_float>_>::Outputs
            ((Outputs<vkt::shaderexecutor::OutTypes<float,_float>_> *)local_c0,(size_t)local_1108);
  highpFmt._24_8_ = (this->m_caseCtx).highpFormat.m_maxValue;
  numErrors = (this->m_caseCtx).highpFormat.m_minExp;
  unique0x1000103f = (this->m_caseCtx).highpFormat.m_maxExp;
  highpFmt.m_minExp = (this->m_caseCtx).highpFormat.m_fractionBits;
  highpFmt.m_maxExp = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  highpFmt.m_fractionBits = (this->m_caseCtx).highpFormat.m_hasInf;
  highpFmt.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasNaN;
  highpFmt._16_8_ = *(undefined8 *)&(this->m_caseCtx).highpFormat.m_exactPrecision;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 100;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  Environment::Environment((Environment *)((long)&status.m_message.field_2 + 8));
  tcu::ResultCollector::ResultCollector((ResultCollector *)&testLog);
  this_02 = Context::getTestContext((this->super_TestInstance).m_context);
  this_03 = tcu::TestContext::getLog(this_02);
  outputArr[1] = std::vector<float,_std::allocator<float>_>::front
                           ((vector<float,_std::allocator<float>_> *)&fmt);
  std::vector<float,_std::allocator<float>_>::front
            ((vector<float,_std::allocator<float>_> *)
             &inputs.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::front
            ((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_> *)
             &inputs.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::front
            ((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_> *)
             &inputs.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1b8 = std::vector<float,_std::allocator<float>_>::front
                        ((vector<float,_std::allocator<float>_> *)local_c0);
  outputArr[0] = std::vector<float,_std::allocator<float>_>::front
                           ((vector<float,_std::allocator<float>_> *)
                            &outputs.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
  tcu::TestLog::operator<<(&local_338,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [12])"Statement: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_stmt);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_338);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::set((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
         *)&it);
  pSVar8 = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator->
                     (&(this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>);
  Statement::getUsedFuncs
            (pSVar8,(set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                     *)&it);
  local_4e8._M_node =
       (_Base_ptr)
       std::
       set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
       ::begin((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                *)&it);
  while( true ) {
    local_4f0._M_node =
         (_Base_ptr)
         std::
         set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
         ::end((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                *)&it);
    bVar4 = std::operator!=(&local_4e8,&local_4f0);
    if (!bVar4) break;
    ppFVar9 = std::_Rb_tree_const_iterator<const_vkt::shaderexecutor::FuncBase_*>::operator*
                        (&local_4e8);
    FuncBase::printDefinition
              (*ppFVar9,(ostream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::_Rb_tree_const_iterator<const_vkt::shaderexecutor::FuncBase_*>::operator++(&local_4e8);
  }
  bVar4 = std::
          set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
          ::empty((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                   *)&it);
  if (!bVar4) {
    tcu::TestLog::operator<<(&local_670,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_670,(char (*) [24])"Reference definitions:\n");
    std::__cxx11::ostringstream::str();
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_690);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_690);
    tcu::MessageBuilder::~MessageBuilder(&local_670);
  }
  std::
  set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~set((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
          *)&it);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  switch(iVar5) {
  case 4:
  case 3:
  case 2:
  case 1:
  default:
    pSVar10 = de::details::
              UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
              ::operator->(&(this->m_executor).
                            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                          );
    pfVar3 = outputs.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ::vk::Handle<(vk::HandleType)22>::Handle((Handle<(vk::HandleType)22> *)&in0.m_hi,0);
    (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,(ulong)pfVar3 & 0xffffffff,outputArr + 1,&local_1b8)
    ;
    tcu::Interval::Interval((Interval *)&in1.m_hi);
    tcu::Interval::Interval((Interval *)local_6c8);
    Void::Void((Void *)((long)&reference0.m_hi + 7));
    Void::Void((Void *)((long)&reference0.m_hi + 6));
    tcu::Interval::Interval((Interval *)&reference1.m_hi);
    tcu::Interval::Interval((Interval *)&valueNdx);
    pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator*
                        ((SharedPtr<const_vkt::shaderexecutor::Variable<float>_> *)
                         &this->m_variables);
    Environment::bind<float>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar11,(IVal *)&in1.m_hi);
    pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator*
                        (&(this->m_variables).in1.
                          super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>);
    Environment::bind<float>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar11,(IVal *)local_6c8);
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in2.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::bind<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12,
               (IVal *)((long)&reference0.m_hi + 7));
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in3.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::bind<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12,
               (IVal *)((long)&reference0.m_hi + 6));
    pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator*
                        (&(this->m_variables).out0.
                          super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>);
    Environment::bind<float>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar11,(IVal *)&reference1.m_hi
              );
    pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator*
                        (&(this->m_variables).out1.
                          super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>);
    Environment::bind<float>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar11,(IVal *)&valueNdx);
    pfStack_708 = (pointer)0x0;
  }
  do {
    if (outputs.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage <= pfStack_708) {
      if (100 < (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        tcu::TestLog::operator<<(&local_d30,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_d30,(char (*) [10])"(Skipped ");
        local_d34 = (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + -100;
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_d34);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])" messages.)");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_d30);
      }
      if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        tcu::TestLog::operator<<(&local_eb8,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_eb8,(char (*) [5])"All ");
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(unsigned_long *)
                                   &outputs.out1.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [16])" inputs passed.");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_eb8);
      }
      else {
        tcu::TestLog::operator<<(&local_1038,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_1038,
                            (int *)&env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x12bd752);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(unsigned_long *)
                                   &outputs.out1.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [16])" inputs failed.");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1038);
      }
      if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_10c0,"Pass",&local_10c1)
        ;
        tcu::TestStatus::pass(__return_storage_ptr__,&local_10c0);
        std::__cxx11::string::~string((string *)&local_10c0);
        std::allocator<char>::~allocator(&local_10c1);
      }
      else {
        de::toString<int>(&local_1078,
                          (int *)&env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1098," test failed. Check log for the details",&local_1099);
        std::operator+(&local_1058,&local_1078,&local_1098);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_1058);
        std::__cxx11::string::~string((string *)&local_1058);
        std::__cxx11::string::~string((string *)&local_1098);
        std::allocator<char>::~allocator(&local_1099);
        std::__cxx11::string::~string((string *)&local_1078);
      }
      local_10a0 = 1;
      tcu::ResultCollector::~ResultCollector((ResultCollector *)&testLog);
      Environment::~Environment((Environment *)((long)&status.m_message.field_2 + 8));
      Outputs<vkt::shaderexecutor::OutTypes<float,_float>_>::~Outputs
                ((Outputs<vkt::shaderexecutor::OutTypes<float,_float>_> *)local_c0);
      Inputs<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      ::~Inputs((Inputs<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *)&fmt);
      return __return_storage_ptr__;
    }
    reference0_1.m_hi._7_1_ = 1;
    tcu::Interval::Interval((Interval *)auStack_728);
    tcu::Interval::Interval((Interval *)auStack_748);
    pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)&fmt,(size_type)pfStack_708);
    round<float>(&local_778,fmt_00,pvVar13);
    convert<float>(&local_760,fmt_00,&local_778);
    pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator*
                        ((SharedPtr<const_vkt::shaderexecutor::Variable<float>_> *)
                         &this->m_variables);
    pIVar14 = Environment::lookup<float>
                        ((Environment *)((long)&status.m_message.field_2 + 8),pVVar11);
    pIVar14->m_hi = local_760.m_hi;
    pIVar14->m_hasNaN = local_760.m_hasNaN;
    *(undefined7 *)&pIVar14->field_0x1 = local_760._1_7_;
    pIVar14->m_lo = local_760.m_lo;
    pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)
                         &inputs.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(size_type)pfStack_708);
    round<float>(&local_7a8,fmt_00,pvVar13);
    convert<float>(&local_790,fmt_00,&local_7a8);
    pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator*
                        (&(this->m_variables).in1.
                          super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>);
    pIVar14 = Environment::lookup<float>
                        ((Environment *)((long)&status.m_message.field_2 + 8),pVVar11);
    pIVar14->m_hi = local_790.m_hi;
    pIVar14->m_hasNaN = local_790.m_hasNaN;
    *(undefined7 *)&pIVar14->field_0x1 = local_790._1_7_;
    pIVar14->m_lo = local_790.m_lo;
    pvVar15 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
              operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&inputs.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(size_type)pfStack_708);
    round<vkt::shaderexecutor::Void>(fmt_00,pvVar15);
    convert<vkt::shaderexecutor::Void>(fmt_00,(IVal *)&ctx.field_0x3e);
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in2.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12);
    pvVar15 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
              operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&inputs.in2.
                             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)pfStack_708);
    round<vkt::shaderexecutor::Void>(fmt_00,pvVar15);
    convert<vkt::shaderexecutor::Void>(fmt_00,(IVal *)((long)&ctx.callDepth + 2));
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in3.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12);
    EvalContext::EvalContext
              ((EvalContext *)local_7f0,fmt_00,(this->m_caseCtx).precision,
               (Environment *)((long)&status.m_message.field_2 + 8),0);
    pSVar8 = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator->
                       (&(this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>);
    Statement::execute(pSVar8,(EvalContext *)local_7f0);
    if (iVar6 == 1) {
LAB_00f88d0a:
      pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator*
                          (&(this->m_variables).out0.
                            super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>);
      pIVar14 = Environment::lookup<float>
                          ((Environment *)((long)&status.m_message.field_2 + 8),pVVar11);
      convert<float>(&local_848,(FloatFormat *)&numErrors,pIVar14);
      reference0_1.m_lo = local_848.m_hi;
      auStack_728 = (undefined1  [8])local_848._0_8_;
      reference0_1._0_8_ = local_848.m_lo;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_c0,(size_type)pfStack_708)
      ;
      bVar4 = contains<float>((IVal *)auStack_728,pvVar13);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_868,"Shader output 0 is outside acceptable range",
                 (allocator<char> *)&builder.field_0x17f);
      bVar4 = tcu::ResultCollector::check((ResultCollector *)&testLog,bVar4,&local_868);
      std::__cxx11::string::~string((string *)&local_868);
      std::allocator<char>::~allocator((allocator<char> *)&builder.field_0x17f);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        reference0_1.m_hi._7_1_ = 0;
      }
    }
    else if (iVar6 == 2) {
      pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator*
                          (&(this->m_variables).out1.
                            super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>);
      pIVar14 = Environment::lookup<float>
                          ((Environment *)((long)&status.m_message.field_2 + 8),pVVar11);
      convert<float>(&local_808,(FloatFormat *)&numErrors,pIVar14);
      reference1_1.m_lo = local_808.m_hi;
      auStack_748 = (undefined1  [8])local_808._0_8_;
      reference1_1._0_8_ = local_808.m_lo;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)
                           &outputs.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(size_type)pfStack_708);
      bVar4 = contains<float>((IVal *)auStack_748,pvVar13);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_828,"Shader output 1 is outside acceptable range",&local_829);
      bVar4 = tcu::ResultCollector::check((ResultCollector *)&testLog,bVar4,&local_828);
      std::__cxx11::string::~string((string *)&local_828);
      std::allocator<char>::~allocator(&local_829);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        reference0_1.m_hi._7_1_ = 0;
      }
      goto LAB_00f88d0a;
    }
    if ((reference0_1.m_hi._7_1_ & 1) == 0) {
      env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    }
    if (((reference0_1.m_hi._7_1_ & 1) == 0) &&
       ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x65)) {
      tcu::TestLog::message((MessageBuilder *)local_9f0,this_03);
      if ((reference0_1.m_hi._7_1_ & 1) == 0) {
        local_11d8 = (char (*) [7])0x12cb4fb;
      }
      else {
        local_11d8 = (char (*) [7])0x12cb502;
      }
      pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_9f0,local_11d8);
      tcu::MessageBuilder::operator<<(pMVar7,(char (*) [10])" sample:\n");
      if (0 < iVar5) {
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_9f0,(char (*) [2])0x12be862);
        pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator->
                            ((SharedPtr<const_vkt::shaderexecutor::Variable<float>_> *)
                             &this->m_variables);
        Variable<float>::getName_abi_cxx11_(&local_a10,pVVar11);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_a10);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x1331044);
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&fmt,(size_type)pfStack_708);
        valueToString<float>(&local_a30,(FloatFormat *)&numErrors,pvVar13);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_a30);
        tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x134b284);
        std::__cxx11::string::~string((string *)&local_a30);
        std::__cxx11::string::~string((string *)&local_a10);
      }
      if (1 < iVar5) {
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_9f0,(char (*) [2])0x12be862);
        pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator->
                            (&(this->m_variables).in1.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>);
        Variable<float>::getName_abi_cxx11_(&local_a50,pVVar11);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_a50);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x1331044);
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &inputs.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(size_type)pfStack_708);
        valueToString<float>(&local_a70,(FloatFormat *)&numErrors,pvVar13);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_a70);
        tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x134b284);
        std::__cxx11::string::~string((string *)&local_a70);
        std::__cxx11::string::~string((string *)&local_a50);
      }
      if (2 < iVar5) {
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_9f0,(char (*) [2])0x12be862);
        pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
                  operator->(&(this->m_variables).in2.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                            );
        Variable<vkt::shaderexecutor::Void>::getName_abi_cxx11_(&local_a90,pVVar12);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_a90);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x1331044);
        pvVar15 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                  ::operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                *)&inputs.in1.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pfStack_708);
        valueToString<vkt::shaderexecutor::Void>(&local_ab0,(FloatFormat *)&numErrors,pvVar15);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_ab0);
        tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x134b284);
        std::__cxx11::string::~string((string *)&local_ab0);
        std::__cxx11::string::~string((string *)&local_a90);
      }
      if (3 < iVar5) {
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_9f0,(char (*) [2])0x12be862);
        pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
                  operator->(&(this->m_variables).in3.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                            );
        Variable<vkt::shaderexecutor::Void>::getName_abi_cxx11_(&local_ad0,pVVar12);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_ad0);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x1331044);
        pvVar15 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                  ::operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                *)&inputs.in2.
                                   super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pfStack_708);
        valueToString<vkt::shaderexecutor::Void>(&local_af0,(FloatFormat *)&numErrors,pvVar15);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_af0);
        tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x134b284);
        std::__cxx11::string::~string((string *)&local_af0);
        std::__cxx11::string::~string((string *)&local_ad0);
      }
      if (0 < iVar6) {
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_9f0,(char (*) [2])0x12be862);
        pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator->
                            (&(this->m_variables).out0.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>);
        Variable<float>::getName_abi_cxx11_(&local_b10,pVVar11);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_b10);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x1331044);
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_c0,
                             (size_type)pfStack_708);
        valueToString<float>(&local_b30,(FloatFormat *)&numErrors,pvVar13);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_b30);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x134b284);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [18])"\tExpected range: ");
        intervalToString<float>(&local_b50,(FloatFormat *)&numErrors,(IVal *)auStack_728);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_b50);
        tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x134b284);
        std::__cxx11::string::~string((string *)&local_b50);
        std::__cxx11::string::~string((string *)&local_b30);
        std::__cxx11::string::~string((string *)&local_b10);
      }
      if (1 < iVar6) {
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_9f0,(char (*) [2])0x12be862);
        pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::operator->
                            (&(this->m_variables).out1.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>);
        Variable<float>::getName_abi_cxx11_(&local_b70,pVVar11);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_b70);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x1331044);
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &outputs.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage,(size_type)pfStack_708);
        valueToString<float>(&local_b90,(FloatFormat *)&numErrors,pvVar13);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_b90);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x134b284);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [18])"\tExpected range: ");
        intervalToString<float>(&local_bb0,(FloatFormat *)&numErrors,(IVal *)auStack_748);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_bb0);
        tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x134b284);
        std::__cxx11::string::~string((string *)&local_bb0);
        std::__cxx11::string::~string((string *)&local_b90);
        std::__cxx11::string::~string((string *)&local_b70);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_9f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_9f0);
    }
    pfStack_708 = (pointer)((long)pfStack_708 + 1);
  } while( true );
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}